

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

int lws_cache_heap_write
              (lws_cache_ttl_lru *_c,char *specific_key,uint8_t *source,size_t size,
              lws_usec_t expiry,void **ppvoid)

{
  lws_dll2_t *__dest;
  lws_cache_ops *plVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  lws_dll2 *plVar5;
  lws_dll2_t *d;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  lws_cache_ops *plVar7;
  lws_cache_ttl_lru *plVar8;
  
  plVar5 = (lws_dll2 *)strlen(specific_key);
  _lws_log(0x10,"%s: %s: len %d\n","lws_cache_heap_write",(_c->info).name,size & 0xffffffff);
  plVar8 = (_c->info).parent;
  if (plVar8 == (lws_cache_ttl_lru *)0x0) {
    plVar8 = _c;
  }
  uVar6 = extraout_RDX;
  plVar1 = _c[1].info.ops;
  while (plVar7 = plVar1, plVar7 != (lws_cache_ops *)0x0) {
    plVar1 = (lws_cache_ops *)plVar7->destroy;
    if (*(char *)((long)&plVar7->invalidate + (long)plVar7->lookup) == '!') {
      iVar4 = (*((plVar8->info).ops)->tag_match)
                        (plVar8,(char *)(plVar7->lookup + (long)((long)&plVar7->invalidate + 1)),
                         specific_key,'\x01');
      uVar6 = extraout_RDX_00;
      if (iVar4 == 0) {
        _lws_cache_heap_item_destroy
                  ((lws_cache_ttl_lru_t_heap_t *)_c,
                   (lws_cache_ttl_item_heap_t *)&plVar7[-1].invalidate);
        uVar6 = extraout_RDX_01;
      }
    }
  }
  while (((uVar2 = (_c->info).max_footprint, uVar2 != 0 && (uVar2 < _c->current_footprint + size))
         || ((uVar2 = (_c->info).max_items, uVar2 != 0 && (uVar2 < *(int *)&_c[1].info.u + 1))))) {
    plVar1 = _c[1].info.ops;
    if (plVar1 != (lws_cache_ops *)0x0) {
      lws_cache_heap_item_destroy
                ((lws_cache_ttl_lru_t_heap_t *)_c,
                 (lws_cache_ttl_item_heap_t *)&plVar1[-1].invalidate,(int)uVar6);
      uVar6 = extraout_RDX_02;
    }
  }
  lws_cache_heap_invalidate(_c,specific_key);
  d = (lws_dll2_t *)lws_realloc((void *)0x0,(long)&plVar5[3].prev + size + 1,"lws_cache_heap_write")
  ;
  if (d == (lws_dll2_t *)0x0) {
    iVar4 = 1;
  }
  else {
    _c->current_footprint = (long)&(d[2].owner)->tail + _c->current_footprint;
    d[2].prev = (lws_dll2 *)0x0;
    d[2].next = (lws_dll2 *)0x0;
    d[1].next = (lws_dll2 *)0x0;
    d[1].owner = (lws_dll2_owner *)0x0;
    d->owner = (lws_dll2_owner *)0x0;
    d[1].prev = (lws_dll2 *)0x0;
    d->prev = (lws_dll2 *)0x0;
    d->next = (lws_dll2 *)0x0;
    d[2].owner = (lws_dll2_owner *)0x0;
    __dest = d + 3;
    if (ppvoid != (void **)0x0) {
      *ppvoid = __dest;
    }
    if (source != (uint8_t *)0x0) {
      memcpy(__dest,source,size);
    }
    memcpy((void *)((long)&__dest->prev + size),specific_key,(size_t)((long)&plVar5->prev + 1));
    d[2].prev = (lws_dll2 *)expiry;
    d[2].next = plVar5;
    d[2].owner = (lws_dll2_owner *)size;
    if (expiry != 0) {
      lws_dll2_add_sorted(d,(lws_dll2_owner_t *)(_c + 1),sort_expiry);
      pcVar3 = _c[1].info.name;
      _lws_log(0x10,"%s: setting exp %llu\n","lws_cache_heap_write",*(undefined8 *)(pcVar3 + 0x30));
      lws_cache_schedule(_c,expiry_cb,*(lws_usec_t *)(pcVar3 + 0x30));
    }
    lws_dll2_add_head(d + 1,(lws_dll2_owner *)&_c[1].info.parent);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int
lws_cache_heap_write(struct lws_cache_ttl_lru *_c, const char *specific_key,
		     const uint8_t *source, size_t size, lws_usec_t expiry,
		     void **ppvoid)
{
	lws_cache_ttl_lru_t_heap_t *cache = (lws_cache_ttl_lru_t_heap_t *)_c;
	struct lws_cache_ttl_lru *backing = _c;
	lws_cache_ttl_item_heap_t *item, *ei;
	size_t kl = strlen(specific_key);
	char *p;

	lwsl_cache("%s: %s: len %d\n", __func__, _c->info.name, (int)size);

	/*
	 * Is this new tag going to invalidate any existing cached meta-results?
	 *
	 * If so, let's destroy any of those first to recover the heap
	 */

	if (backing->info.parent)
		backing = backing->info.parent;

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   cache->items_lru.head) {
		lws_cache_ttl_item_heap_t *i = lws_container_of(d,
						lws_cache_ttl_item_heap_t,
						list_lru);
		const char *iname = ((const char *)&i[1]) + i->size;

		if (*iname == META_ITEM_LEADING) {

			/*
			 * If the item about to be added would match any cached
			 * results from before it was added, we have to
			 * invalidate them.  To check this, we have to use the
			 * matching rules at the backing store level
			 */

			if (!backing->info.ops->tag_match(backing, iname + 1,
							  specific_key, 1))
				_lws_cache_heap_item_destroy(cache, i);
		}

	} lws_end_foreach_dll_safe(d, d1);


	/*
	 * Keep us under the limit if possible... note this will always allow
	 * caching a single large item even if it is above the limits
	 */

	while ((cache->cache.info.max_footprint &&
	        cache->cache.current_footprint + size >
					     cache->cache.info.max_footprint) ||
	       (cache->cache.info.max_items &&
		cache->items_lru.count + 1 > cache->cache.info.max_items))
		lws_cache_item_evict_lru(cache);

	/* remove any existing entry of the same key */

	lws_cache_heap_invalidate(&cache->cache, specific_key);

	item = lws_fi(&_c->info.cx->fic, "cache_write_oom") ? NULL :
			lws_malloc(sizeof(*item) + kl + 1u + size, __func__);
	if (!item)
		return 1;

	cache->cache.current_footprint += item->size;

	/* only need to zero down our item object */
	memset(item, 0, sizeof(*item));

	p = (char *)&item[1];
	if (ppvoid)
		*ppvoid = p;

	/* copy the payload into place */
	if (source)
		memcpy(p, source, size);

	/* copy the key string into place, with terminating NUL */
	memcpy(p + size, specific_key, kl + 1);

	item->expiry = expiry;
	item->key_len = kl;
	item->size = size;

	if (expiry) {
		/* adding to expiry is optional, on nonzero expiry */
		lws_dll2_add_sorted(&item->list_expiry, &cache->items_expiry,
				    sort_expiry);
		ei = lws_container_of(cache->items_expiry.head,
				      lws_cache_ttl_item_heap_t, list_expiry);
		lwsl_debug("%s: setting exp %llu\n", __func__,
						(unsigned long long)ei->expiry);
		lws_cache_schedule(&cache->cache, expiry_cb, ei->expiry);
	}

	/* always add outselves to head of lru list */
	lws_dll2_add_head(&item->list_lru, &cache->items_lru);

	return 0;
}